

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::MultiReporter::addReporter(MultiReporter *this,IEventListenerPtr *reporter)

{
  ReporterPreferences *pRVar1;
  bool *pbVar2;
  IEventListener *pIVar3;
  
  pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator*(reporter);
  pRVar1 = &(this->super_IEventListener).m_preferences;
  pRVar1->shouldRedirectStdOut =
       (bool)(pRVar1->shouldRedirectStdOut | (pIVar3->m_preferences).shouldRedirectStdOut);
  pbVar2 = &(this->super_IEventListener).m_preferences.shouldReportAllAssertions;
  *pbVar2 = (bool)(*pbVar2 | (pIVar3->m_preferences).shouldReportAllAssertions);
  pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(reporter);
  this->m_haveNoncapturingReporters =
       (bool)(this->m_haveNoncapturingReporters | (pIVar3->m_preferences).shouldRedirectStdOut ^ 1U)
  ;
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>>>
  ::emplace_back<Catch::Detail::unique_ptr<Catch::IEventListener>>
            ((vector<Catch::Detail::unique_ptr<Catch::IEventListener>,std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>>>
              *)&this->m_reporterLikes,reporter);
  return;
}

Assistant:

void MultiReporter::addReporter( IEventListenerPtr&& reporter ) {
        updatePreferences(*reporter);

        // We will need to output the captured stdout if there are reporters
        // that do not want it captured.
        // We do not consider listeners, because it is generally assumed that
        // listeners are output-transparent, even though they can ask for stdout
        // capture to do something with it.
        m_haveNoncapturingReporters |= !reporter->getPreferences().shouldRedirectStdOut;

        // Reporters can always be placed to the back without breaking the
        // reporting order
        m_reporterLikes.push_back( CATCH_MOVE( reporter ) );
    }